

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O3

int __thiscall
iDynTree::ModelSolidShapes::copy(ModelSolidShapes *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  clear(this);
  std::
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  ::resize(&this->linkSolidShapes,(*(long *)(dst + 8) - *(long *)dst >> 3) * -0x5555555555555555);
  lVar3 = *(long *)dst;
  if (*(long *)(dst + 8) != lVar3) {
    uVar6 = 0;
    do {
      lVar1 = uVar6 * 0x18;
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::resize
                ((this->linkSolidShapes).
                 super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar6,
                 *(long *)(lVar3 + 8 + lVar1) - *(long *)(lVar3 + lVar1) >> 3);
      lVar3 = *(long *)dst;
      lVar4 = *(long *)(lVar3 + lVar1);
      if (*(long *)(lVar3 + 8 + lVar1) != lVar4) {
        uVar5 = 0;
        do {
          uVar2 = (**(code **)(**(long **)(lVar4 + uVar5 * 8) + 0x10))();
          *(undefined8 *)
           (*(long *)&(this->linkSolidShapes).
                      super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].
                      super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                      ._M_impl + uVar5 * 8) = uVar2;
          uVar5 = uVar5 + 1;
          lVar3 = *(long *)dst;
          lVar4 = *(long *)(lVar3 + lVar1);
        } while (uVar5 < (ulong)(*(long *)(lVar3 + 8 + lVar1) - lVar4 >> 3));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((*(long *)(dst + 8) - lVar3 >> 3) * -0x5555555555555555));
  }
  return (int)this;
}

Assistant:

ModelSolidShapes& ModelSolidShapes::copy(const ModelSolidShapes& other)
    {
        clear();
        this->linkSolidShapes.resize(other.linkSolidShapes.size());
        for (size_t link = 0; link < other.linkSolidShapes.size(); link++)
        {
            this->linkSolidShapes[link].resize(other.linkSolidShapes[link].size());
            for (size_t geom = 0; geom < other.linkSolidShapes[link].size(); geom++)
            {
                this->linkSolidShapes[link][geom] = other.linkSolidShapes[link][geom]->clone();
            }
        }

        return *this;
    }